

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O0

Type __thiscall embree::SceneGraph::PlyParser::parseType(PlyParser *this,stringstream *cin)

{
  Type TVar1;
  bool bVar2;
  Tag data;
  Tag TVar3;
  istream *in_RSI;
  string ty1;
  string ty0;
  string ty;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  istream *local_20;
  Type local_c;
  
  local_20 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::operator>>(local_20,local_40);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  if (bVar2) {
    std::__cxx11::string::string(local_70);
    std::operator>>(local_20,local_70);
    std::__cxx11::string::string(local_90);
    std::operator>>(local_20,local_90);
    TVar3 = typeTagOfString(in_stack_ffffffffffffff58);
    data = typeTagOfString(in_stack_ffffffffffffff58);
    Type::Type(&local_c,PTY_LIST,TVar3,data);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
  }
  else {
    TVar3 = typeTagOfString(in_stack_ffffffffffffff58);
    Type::Type(&local_c,TVar3);
  }
  std::__cxx11::string::~string(local_40);
  TVar1.data = local_c.data;
  TVar1.ty = local_c.ty;
  TVar1.index = local_c.index;
  return TVar1;
}

Assistant:

Type parseType(std::stringstream& cin) 
      {
        std::string ty; cin >> ty;
        if (ty == "list") {
          std::string ty0; cin >> ty0;
          std::string ty1; cin >> ty1;
          return Type(Type::PTY_LIST,typeTagOfString(ty0),typeTagOfString(ty1));
        } else return Type(typeTagOfString(ty));
      }